

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys.cpp
# Opt level: O1

int __thiscall
jbcoin::ValidatorKeys::sign
          (ValidatorKeys *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen)

{
  Slice *slice;
  void *local_40;
  undefined8 local_38;
  Slice local_30;
  jbcoin local_20 [8];
  undefined8 local_18;
  
  local_30.data_ = *(uint8_t **)sig;
  local_30.size_ = *(size_t *)(sig + 8);
  jbcoin::sign((jbcoin *)&local_40,(PublicKey *)(ctx + 8),(SecretKey *)(ctx + 0x38),&local_30);
  local_18 = local_38;
  strHex_abi_cxx11_((string *)this,local_20,slice);
  if (local_40 != (void *)0x0) {
    operator_delete__(local_40);
  }
  return (int)this;
}

Assistant:

std::string
ValidatorKeys::sign (std::string const& data)
{
    return strHex(jbcoin::sign (publicKey_, secretKey_, makeSlice (data)));
}